

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

CJumpNotEqualCommand * __thiscall
AssemblyCode::CJumpNotEqualCommand::ToString_abi_cxx11_(CJumpNotEqualCommand *this)

{
  CTemp local_108;
  CTemp local_d8;
  string local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  CJumpNotEqualCommand *this_local;
  
  this_local = this;
  IRT::CTemp::ToString_abi_cxx11_(&local_d8);
  std::operator+((char *)local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"cmp ");
  std::operator+(local_98,(char *)local_b8);
  IRT::CTemp::ToString_abi_cxx11_(&local_108);
  std::operator+(local_78,local_98);
  std::operator+(local_58,(char *)local_78);
  std::operator+(local_38,local_58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  return this;
}

Assistant:

std::string AssemblyCode::CJumpNotEqualCommand::ToString( ) const {
    return "cmp " + leftOperand.ToString( ) + " " + rightOperand.ToString( ) + "\njne " + label + "\n";
}